

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

VmInstruction *
anon_unknown.dwarf_12e14a::GetCopyInfo
          (VmModule *module,VmValue *pointer,VmConstant *offset,uint accessSize)

{
  char *pcVar1;
  LoadStoreInfo *pLVar2;
  VmInstruction *pVVar3;
  long lVar4;
  VmValue *pVVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  
  if (offset == (VmConstant *)0x0) {
    iVar7 = 0;
  }
  else {
    iVar7 = offset->iValue;
  }
  if ((pointer == (VmValue *)0x0) || (pointer->typeID != 1)) {
    uVar6 = (ulong)(module->loadStoreInfo).count;
    if (uVar6 != 0) {
      pLVar2 = (module->loadStoreInfo).data;
      lVar8 = 0;
      do {
        pVVar3 = *(VmInstruction **)((long)&pLVar2->copyInst + lVar8);
        if ((((pVVar3 != (VmInstruction *)0x0) &&
             (pVVar5 = *(VmValue **)((long)&pLVar2->storePointer + lVar8),
             pVVar5 == pointer && pVVar5 != (VmValue *)0x0)) &&
            (*(int *)(*(long *)((long)&pLVar2->storeOffset + lVar8) + 0x98) == iVar7)) &&
           (*(uint *)((long)&pLVar2->accessSize + lVar8) == accessSize)) {
          if (pVVar3->parent != (VmBlock *)0x0) {
            return pVVar3;
          }
          __assert_fail("el.copyInst->parent",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0x701,
                        "VmInstruction *(anonymous namespace)::GetCopyInfo(VmModule *, VmValue *, VmConstant *, unsigned int)"
                       );
        }
        lVar8 = lVar8 + 0x58;
      } while (uVar6 * 0x58 - lVar8 != 0);
    }
  }
  else {
    pcVar1 = pointer[1].comment.end;
    if (pcVar1 != (char *)0x0) {
      if (iVar7 != 0) {
        __assert_fail("offsetValue == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0x6e6,
                      "VmInstruction *(anonymous namespace)::GetCopyInfo(VmModule *, VmValue *, VmConstant *, unsigned int)"
                     );
      }
      uVar6 = (ulong)(module->loadStoreInfo).count;
      if (uVar6 != 0) {
        pLVar2 = (module->loadStoreInfo).data;
        lVar8 = 0;
        do {
          pVVar3 = *(VmInstruction **)((long)&pLVar2->copyInst + lVar8);
          if (((pVVar3 != (VmInstruction *)0x0) &&
              (lVar4 = *(long *)((long)&pLVar2->storeAddress + lVar8), lVar4 != 0)) &&
             ((*(char **)(lVar4 + 200) == pcVar1 &&
              ((*(int *)(lVar4 + 0x98) == *(int *)&pointer[1]._vptr_VmValue &&
               (*(uint *)((long)&pLVar2->accessSize + lVar8) == accessSize)))))) {
            if (pVVar3->parent != (VmBlock *)0x0) {
              return pVVar3;
            }
            __assert_fail("el.copyInst->parent",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x6f0,
                          "VmInstruction *(anonymous namespace)::GetCopyInfo(VmModule *, VmValue *, VmConstant *, unsigned int)"
                         );
          }
          lVar8 = lVar8 + 0x58;
        } while (uVar6 * 0x58 - lVar8 != 0);
      }
    }
  }
  return (VmInstruction *)0x0;
}

Assistant:

VmInstruction* GetCopyInfo(VmModule *module, VmValue *pointer, VmConstant *offset, unsigned accessSize)
	{
		int offsetValue = offset ? offset->iValue : 0;

		if(VmConstant *address = getType<VmConstant>(pointer))
		{
			if(!address->container)
				return NULL;

			assert(offsetValue == 0);

			for(unsigned i = 0; i < module->loadStoreInfo.size(); i++)
			{
				VmModule::LoadStoreInfo &el = module->loadStoreInfo[i];

				if(el.copyInst && el.storeAddress)
				{
					if(el.storeAddress->container == address->container && el.storeAddress->iValue == address->iValue && accessSize == el.accessSize)
					{
						assert(el.copyInst->parent);

						return el.copyInst;
					}
				}
			}
		}
		else
		{
			for(unsigned i = 0; i < module->loadStoreInfo.size(); i++)
			{
				VmModule::LoadStoreInfo &el = module->loadStoreInfo[i];

				if(el.copyInst && el.storePointer)
				{
					if(el.storePointer == pointer && el.storeOffset->iValue == offsetValue && accessSize == el.accessSize)
					{
						assert(el.copyInst->parent);

						return el.copyInst;
					}
				}
			}
		}

		return NULL;
	}